

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O0

const_iterator __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::lower_bound(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              *this,QAbstractButton **key)

{
  const_iterator ppQVar1;
  const_iterator ppQVar2;
  undefined8 in_RSI;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *in_RDI;
  const_iterator cVar3;
  QVLABase<QAbstractButton_*> *in_stack_ffffffffffffffc0;
  QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
  *in_stack_ffffffffffffffd8;
  
  ppQVar1 = QVLABase<QAbstractButton_*>::begin((QVLABase<QAbstractButton_*> *)0x674a71);
  ppQVar2 = QVLABase<QAbstractButton_*>::end(in_stack_ffffffffffffffc0);
  key_comp(in_RDI);
  std::lower_bound<QAbstractButton*const*,QAbstractButton*,std::less<QAbstractButton*>>
            (ppQVar1,ppQVar2,in_RSI);
  cVar3 = fromKeysIterator(in_stack_ffffffffffffffd8,(const_iterator)in_RDI);
  return cVar3;
}

Assistant:

const_iterator lower_bound(const Key &key) const
    {
        return fromKeysIterator(std::lower_bound(c.keys.begin(), c.keys.end(), key, key_comp()));
    }